

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialog::changeEvent(QProgressDialog *this,QEvent *ev)

{
  Type TVar1;
  QProgressDialogPrivate *event;
  QWidget *in_RSI;
  QProgressDialogPrivate *in_RDI;
  QProgressDialogPrivate *d;
  QProgressDialogPrivate *in_stack_00000070;
  
  event = d_func((QProgressDialog *)0x7b2221);
  TVar1 = QEvent::type((QEvent *)in_RSI);
  if (TVar1 == StyleChange) {
    QProgressDialogPrivate::layout(in_stack_00000070);
  }
  else {
    TVar1 = QEvent::type((QEvent *)in_RSI);
    if (TVar1 == LanguageChange) {
      QProgressDialogPrivate::retranslateStrings(in_RDI);
    }
  }
  QWidget::changeEvent(in_RSI,(QEvent *)event);
  return;
}

Assistant:

void QProgressDialog::changeEvent(QEvent *ev)
{
    Q_D(QProgressDialog);
    if (ev->type() == QEvent::StyleChange) {
        d->layout();
    } else if (ev->type() == QEvent::LanguageChange) {
        d->retranslateStrings();
    }
    QDialog::changeEvent(ev);
}